

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createRvalueSwizzle
          (Builder *this,Decoration precision,Id typeId,Id source,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *channels)

{
  uint *puVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  pointer puVar4;
  Id IVar5;
  _Head_base<0UL,_spv::Instruction_*,_false> this_00;
  ulong uVar6;
  int i;
  long lVar7;
  allocator_type local_55;
  Decoration local_54;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  
  puVar1 = (channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar7 == 4) {
    IVar5 = createCompositeExtract(this,source,typeId,*puVar1);
  }
  else {
    local_54 = precision;
    if (this->generatingOpCodeForSpecConst == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,2,
                 &local_55);
      operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[1] = source;
      *operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = source;
      IVar5 = createSpecConstantOp
                        (this,OpVectorShuffle,typeId,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                         channels);
      IVar5 = setPrecision(this,IVar5,local_54);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return IVar5;
    }
    this_00._M_head_impl = (Instruction *)::operator_new(0x60);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    (this_00._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
    (this_00._M_head_impl)->resultId = IVar5;
    (this_00._M_head_impl)->typeId = typeId;
    (this_00._M_head_impl)->opCode = OpVectorShuffle;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (this_00._M_head_impl)->block = (Block *)0x0;
    ppIVar2 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar3 = ppIVar2[source];
    if (pIVar3 == (Instruction *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)pIVar3->typeId;
    }
    if (ppIVar2[uVar6]->opCode != OpTypeVector) {
      __assert_fail("isVector(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xbaf,
                    "Id spv::Builder::createRvalueSwizzle(Decoration, Id, Id, const std::vector<unsigned int> &)"
                   );
    }
    Instruction::reserveOperands(this_00._M_head_impl,(lVar7 >> 2) + 2);
    Instruction::addIdOperand(this_00._M_head_impl,source);
    Instruction::addIdOperand(this_00._M_head_impl,source);
    for (lVar7 = 0;
        puVar4 = (channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start,
        lVar7 < (int)((ulong)((long)(channels->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2)
        ; lVar7 = lVar7 + 1) {
      Instruction::addImmediateOperand(this_00._M_head_impl,puVar4[lVar7]);
    }
    local_50._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         this_00._M_head_impl;
    addInstruction(this,&local_50);
    if (local_50._M_t.
        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_50._M_t.
                            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    IVar5 = (this_00._M_head_impl)->resultId;
    precision = local_54;
  }
  IVar5 = setPrecision(this,IVar5,precision);
  return IVar5;
}

Assistant:

Id Builder::createRvalueSwizzle(Decoration precision, Id typeId, Id source, const std::vector<unsigned>& channels)
{
    if (channels.size() == 1)
        return setPrecision(createCompositeExtract(source, typeId, channels.front()), precision);

    if (generatingOpCodeForSpecConst) {
        std::vector<Id> operands(2);
        operands[0] = operands[1] = source;
        return setPrecision(createSpecConstantOp(OpVectorShuffle, typeId, operands, channels), precision);
    }
    Instruction* swizzle = new Instruction(getUniqueId(), typeId, OpVectorShuffle);
    assert(isVector(source));
    swizzle->reserveOperands(channels.size() + 2);
    swizzle->addIdOperand(source);
    swizzle->addIdOperand(source);
    for (int i = 0; i < (int)channels.size(); ++i)
        swizzle->addImmediateOperand(channels[i]);
    addInstruction(std::unique_ptr<Instruction>(swizzle));

    return setPrecision(swizzle->getResultId(), precision);
}